

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O2

string * __thiscall
just::process::exit_reason_abi_cxx11_(string *__return_storage_ptr__,process *this,int status_)

{
  ostream *poVar1;
  uint uVar2;
  char *__s;
  ostringstream s;
  ostringstream local_190 [376];
  
  uVar2 = (uint)this & 0x7f;
  if ((int)(uVar2 * 0x1000000 + 0x1000000) < 0x2000000) {
    if ((char)this < '\0') {
      __s = "\nProcess core dumped.";
    }
    else {
      if (uVar2 == 0x7f) {
        std::__cxx11::ostringstream::ostringstream(local_190);
        poVar1 = std::operator<<((ostream *)local_190,"\nProcess was stopped with signal ");
        poVar1 = (ostream *)
                 std::ostream::operator<<((ostream *)poVar1,(uint)(byte)((ulong)this >> 8));
        std::operator<<(poVar1,".");
        std::__cxx11::stringbuf::str();
        goto LAB_0010b917;
      }
      __s = "";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)local_190);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar1 = std::operator<<((ostream *)local_190,"\nProcess died due to unhandled signal ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,uVar2);
    std::operator<<(poVar1,".");
    std::__cxx11::stringbuf::str();
LAB_0010b917:
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string exit_reason(int status_)
    {
      if (WIFSIGNALED(status_))
      {
        std::ostringstream s;
        s << "\nProcess died due to unhandled signal " << WTERMSIG(status_)
          << ".";
        return s.str();
      }
      else if (WCOREDUMP(status_))
      {
        return "\nProcess core dumped.";
      }
      else if (WIFSTOPPED(status_))
      {
        std::ostringstream s;
        s << "\nProcess was stopped with signal " << WSTOPSIG(status_) << ".";
        return s.str();
      }
      else
      {
        return "";
      }
    }